

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void wake_nearby(void)

{
  int iVar1;
  monst *local_10;
  monst *mtmp;
  
  for (local_10 = level->monlist; local_10 != (monst *)0x0; local_10 = local_10->nmon) {
    if ((((0 < local_10->mhp) &&
         (iVar1 = dist2((int)local_10->mx,(int)local_10->my,(int)u.ux,(int)u.uy),
         SBORROW4(iVar1,u.ulevel * 0x14) != iVar1 + u.ulevel * -0x14 < 0)) &&
        (*(uint *)&local_10->field_0x60 = *(uint *)&local_10->field_0x60 & 0xfff7ffff,
        local_10->mtame != '\0')) && ((*(uint *)&local_10->field_0x60 >> 0x1a & 1) == 0)) {
      *(uint *)&local_10[1].data = moves;
    }
  }
  return;
}

Assistant:

void wake_nearby(void)
{
	struct monst *mtmp;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	    if (!DEADMONSTER(mtmp) && distu(mtmp->mx,mtmp->my) < u.ulevel*20) {
		mtmp->msleeping = 0;
		if (mtmp->mtame && !mtmp->isminion)
		    EDOG(mtmp)->whistletime = moves;
	    }
	}
}